

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

int __thiscall PeleLM::init(PeleLM *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pSVar7;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  long lVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  int extraout_EAX;
  int *piVar16;
  double *pdVar17;
  double *pdVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  double *pdVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  bool bVar28;
  Real time;
  Box local_53c;
  Array4<double> *local_520;
  Array4<const_double> *local_518;
  Array4<double> *local_510;
  Array4<const_double> *local_508;
  long local_500;
  long local_4f8;
  Array4<const_double> *local_4f0;
  Array4<double> *local_4e8;
  Array4<const_double> *local_4e0;
  Array4<double> *local_4d8;
  long local_4d0;
  ulong local_4c8;
  IntVect local_4bc;
  MFIter mfi;
  FillPatchIterator FctCntfpi;
  FillPatchIterator Ydotfpi;
  
  NavierStokesBase::init(&this->super_NavierStokesBase,ctx);
  time = amrex::StateData::curTime(*(StateData **)(ctx + 0x170));
  pSVar7 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar7[RhoYdot_Type].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar7[FuncCount_Type].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  RhoH_to_Temp((MultiFab *)
               (pSVar7->new_data)._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,0,0);
  amrex::FillPatchIterator::FillPatchIterator
            (&Ydotfpi,(AmrLevel *)ctx,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             ((IntVect *)
             ((long)this_00.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect[0],
             time,RhoYdot_Type,0,9);
  amrex::FillPatchIterator::FillPatchIterator
            (&FctCntfpi,(AmrLevel *)ctx,
             (MultiFab *)
             this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             ((IntVect *)
             ((long)this_01.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect[0],
             time,FuncCount_Type,0,1);
  local_508 = (Array4<const_double> *)
              amrex::FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                        (&Ydotfpi.m_fabs.super_FabArray<amrex::FArrayBox>);
  local_510 = (Array4<double> *)
              amrex::FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>
                        ((FabArray<amrex::FArrayBox> *)
                         this_00.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  local_518 = (Array4<const_double> *)
              amrex::FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                        (&FctCntfpi.m_fabs.super_FabArray<amrex::FArrayBox>);
  local_520 = (Array4<double> *)
              amrex::FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>
                        ((FabArray<amrex::FArrayBox> *)
                         this_01.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  local_4bc.vect[0] = 0;
  local_4bc.vect[1] = 0;
  local_4bc.vect[2] = 0;
  local_53c.smallend.vect[1] = amrex::Gpu::Device::max_gpu_streams;
  local_53c.smallend.vect[2] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_53c.bigend.vect[0] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_53c.bigend.vect[1] = DAT_006ddef0;
  local_53c.smallend.vect[0] = CONCAT13(local_53c.smallend.vect[0]._3_1_,0x10001);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&Ydotfpi.m_fabs,(MFItInfo *)&local_53c);
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::growntilebox(&local_53c,&mfi,&local_4bc);
    piVar16 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar16 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + mfi.currentIndex;
    }
    iVar22 = *piVar16;
    lVar20 = (long)local_53c.smallend.vect[0];
    local_500 = (long)local_53c.smallend.vect[1];
    lVar23 = (long)local_53c.smallend.vect[2];
    local_4c8 = (ulong)(uint)local_53c.bigend.vect[0];
    local_4e0 = local_518 + iVar22;
    local_4e8 = local_520 + iVar22;
    local_4f0 = local_508 + iVar22;
    local_4d8 = local_510 + iVar22;
    local_4f8 = lVar20 * 8;
    while( true ) {
      iVar22 = (int)lVar23;
      lVar21 = local_500;
      if (local_53c.bigend.vect[2] < iVar22) break;
      for (; iVar19 = (int)lVar21, iVar19 <= local_53c.bigend.vect[1]; lVar21 = lVar21 + 1) {
        if (local_53c.smallend.vect[0] <= local_53c.bigend.vect[0]) {
          iVar1 = (local_4e0->begin).y;
          lVar8 = local_4e0->jstride;
          iVar2 = (local_4e0->begin).z;
          lVar9 = local_4e0->kstride;
          pdVar10 = local_4e0->p;
          iVar3 = (local_4e0->begin).x;
          iVar4 = (local_4e8->begin).x;
          iVar5 = (local_4e8->begin).y;
          lVar11 = local_4e8->jstride;
          iVar6 = (local_4e8->begin).z;
          lVar12 = local_4e8->kstride;
          pdVar13 = local_4e8->p;
          local_4d0 = (long)(local_4f0->begin).y;
          pdVar27 = local_4d8->p +
                    lVar20 + (((lVar23 - (local_4d8->begin).z) * local_4d8->kstride +
                              (lVar21 - (local_4d8->begin).y) * local_4d8->jstride) -
                             (long)(local_4d8->begin).x);
          lVar14 = local_4f0->nstride;
          lVar15 = local_4d8->nstride;
          pdVar17 = local_4f0->p +
                    lVar20 + (((lVar23 - (local_4f0->begin).z) * local_4f0->kstride +
                              (lVar21 - local_4d0) * local_4f0->jstride) -
                             (long)(local_4f0->begin).x);
          lVar25 = lVar20;
          do {
            pdVar13[((long)iVar19 - (long)iVar5) * lVar11 +
                    ((long)iVar22 - (long)iVar6) * lVar12 + (lVar25 - iVar4)] =
                 pdVar10[((long)iVar19 - (long)iVar1) * lVar8 +
                         ((long)iVar22 - (long)iVar2) * lVar9 + (lVar25 - iVar3)];
            pdVar18 = pdVar17;
            pdVar24 = pdVar27;
            lVar26 = 9;
            while (bVar28 = lVar26 != 0, lVar26 = lVar26 + -1, bVar28) {
              *pdVar24 = *pdVar18;
              pdVar24 = pdVar24 + lVar15;
              pdVar18 = pdVar18 + lVar14;
            }
            lVar25 = lVar25 + 1;
            pdVar27 = pdVar27 + 1;
            pdVar17 = pdVar17 + 1;
          } while (local_53c.bigend.vect[0] + 1U != (int)lVar25);
        }
      }
      lVar23 = lVar23 + 1;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::FillPatchIterator::~FillPatchIterator(&FctCntfpi);
  amrex::FillPatchIterator::~FillPatchIterator(&Ydotfpi);
  return extraout_EAX;
}

Assistant:

void
PeleLM::init (AmrLevel& old)
{
   NavierStokesBase::init(old);

   PeleLM* oldht    = (PeleLM*) &old;
   const Real    tnp1 = oldht->state[State_Type].curTime();

   //
   // Get good version of rhoYdot and Function count
   //
   MultiFab& Ydot = get_new_data(RhoYdot_Type);
   MultiFab& FuncCount = get_new_data(FuncCount_Type);
   RhoH_to_Temp(get_new_data(State_Type));

   FillPatchIterator Ydotfpi(*oldht,Ydot,Ydot.nGrow(),tnp1,RhoYdot_Type,0,NUM_SPECIES);
   const MultiFab& Ydot_old = Ydotfpi.get_mf();

   FillPatchIterator FctCntfpi(*oldht,FuncCount,FuncCount.nGrow(),tnp1,FuncCount_Type,0,1);
   const MultiFab& FuncCount_old = FctCntfpi.get_mf();

   auto const& orYdotma = Ydot_old.const_arrays();
   auto const& nrYdotma = Ydot.arrays();
   auto const& oFctCma  = FuncCount_old.const_arrays();
   auto const& nFctCma  = FuncCount.arrays();
   amrex::ParallelFor(Ydot_old,
   [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
   {
      nFctCma[box_no](i,j,k) = oFctCma[box_no](i,j,k);
      for (int n = 0; n < NUM_SPECIES; n++) {
         nrYdotma[box_no](i,j,k,n) = orYdotma[box_no](i,j,k,n);
      }
   });
}